

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

JavascriptPromiseCapability *
Js::JavascriptPromise::NewPromiseCapability(Var constructor,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  bool bVar2;
  RecyclableObject *constructor_00;
  JavascriptPromiseCapability *pJVar3;
  
  bVar2 = JavascriptOperators::IsConstructor(constructor);
  if (bVar2) {
    constructor_00 = VarTo<Js::RecyclableObject>(constructor);
    pTVar1 = scriptContext->threadContext;
    bVar2 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    pJVar3 = CreatePromiseCapabilityRecord(constructor_00,scriptContext);
    pTVar1->reentrancySafeOrHandled = bVar2;
    return pJVar3;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
}

Assistant:

JavascriptPromiseCapability* JavascriptPromise::NewPromiseCapability(Var constructor, ScriptContext* scriptContext)
    {
        if (!JavascriptOperators::IsConstructor(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }

        RecyclableObject* constructorFunc = VarTo<RecyclableObject>(constructor);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CreatePromiseCapabilityRecord(constructorFunc, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
    }